

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  bool bVar1;
  bool local_a2;
  bool local_a1;
  allocator<char> local_91;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58;
  cmTarget *local_38;
  cmTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool excludeFromAll_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  string *psStack_18;
  TargetType type_local;
  string *lname_local;
  cmMakefile *this_local;
  
  bVar1 = true;
  if ((((type != STATIC_LIBRARY) && (bVar1 = true, type != SHARED_LIBRARY)) &&
      (bVar1 = true, type != MODULE_LIBRARY)) && (bVar1 = true, type != OBJECT_LIBRARY)) {
    bVar1 = type == INTERFACE_LIBRARY;
  }
  target._7_1_ = excludeFromAll;
  pvStack_28 = srcs;
  srcs_local._4_4_ = type;
  psStack_18 = lname;
  lname_local = (string *)this;
  if (bVar1) {
    local_38 = AddNewTarget(this,type,lname);
    cmTarget::ClearDependencyInformation(local_38,this);
    local_5a = 0;
    local_6d = 0;
    local_a1 = true;
    if ((target._7_1_ & 1) == 0) {
      local_a2 = false;
      if (srcs_local._4_4_ != INTERFACE_LIBRARY) {
        std::allocator<char>::allocator();
        local_5a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"EXCLUDE_FROM_ALL",&local_59);
        local_6d = 1;
        local_a2 = GetPropertyAsBool(this,&local_58);
      }
      local_a1 = local_a2;
    }
    if ((local_6d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((local_5a & 1) != 0) {
      std::allocator<char>::~allocator(&local_59);
    }
    this_00 = local_38;
    if (local_a1 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"EXCLUDE_FROM_ALL",&local_91);
      cmTarget::SetProperty(this_00,&local_90,"TRUE");
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    cmTarget::AddSources(local_38,pvStack_28);
    AddGlobalLinkInformation(this,local_38);
    return local_38;
  }
  __assert_fail("type == cmStateEnums::STATIC_LIBRARY || type == cmStateEnums::SHARED_LIBRARY || type == cmStateEnums::MODULE_LIBRARY || type == cmStateEnums::OBJECT_LIBRARY || type == cmStateEnums::INTERFACE_LIBRARY"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                ,0x7c7,
                "cmTarget *cmMakefile::AddLibrary(const std::string &, cmStateEnums::TargetType, const std::vector<std::string> &, bool)"
               );
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                                 cmStateEnums::TargetType type,
                                 const std::vector<std::string>& srcs,
                                 bool excludeFromAll)
{
  assert(type == cmStateEnums::STATIC_LIBRARY ||
         type == cmStateEnums::SHARED_LIBRARY ||
         type == cmStateEnums::MODULE_LIBRARY ||
         type == cmStateEnums::OBJECT_LIBRARY ||
         type == cmStateEnums::INTERFACE_LIBRARY);

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation(*this);
  if (excludeFromAll ||
      (type != cmStateEnums::INTERFACE_LIBRARY &&
       this->GetPropertyAsBool("EXCLUDE_FROM_ALL"))) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}